

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool setFontWeightFromValue(Value *value,QFont *font)

{
  long lVar1;
  int iVar2;
  double *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined8 in_stack_ffffffffffffffb8;
  Weight WVar3;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  bool local_21;
  
  WVar3 = (Weight)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI == 6) {
    iVar2 = QVariant::toInt((bool *)(in_RDI + 2));
    if (iVar2 == 1) {
      QFont::setWeight((QFont *)CONCAT44(1,in_stack_ffffffffffffffc0),WVar3);
      local_21 = true;
    }
    else if (iVar2 == 0xd) {
      QFont::setWeight((QFont *)CONCAT44(0xd,in_stack_ffffffffffffffc0),WVar3);
      local_21 = true;
    }
    else {
      local_21 = false;
    }
  }
  else if (*in_RDI == 1) {
    QVariant::toDouble((bool *)(in_RDI + 2));
    qBound<double>((double *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RSI,
                   (double *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    WVar3 = (Weight)((ulong)in_RSI >> 0x20);
    qRound(5.28398168757626e-317);
    QFont::setWeight((QFont *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),WVar3);
    local_21 = true;
  }
  else {
    local_21 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

static bool setFontWeightFromValue(const QCss::Value &value, QFont *font)
{
    if (value.type == Value::KnownIdentifier) {
        switch (value.variant.toInt()) {
            case Value_Normal: font->setWeight(QFont::Normal); return true;
            case Value_Bold: font->setWeight(QFont::Bold); return true;
            default: break;
        }
        return false;
    }
    if (value.type != Value::Number)
        return false;
    // .toInt() would call qRound64() and might overflow the long long there
    font->setWeight(QFont::Weight(qRound(qBound(0.0, value.variant.toDouble(), 1001.0))));
    return true;
}